

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v11::detail::fwrite_all(void *ptr,size_t count,FILE *stream)

{
  size_t sVar1;
  undefined8 uVar2;
  uint *puVar3;
  format_string<> fmt;
  
  sVar1 = fwrite(ptr,1,count,(FILE *)stream);
  if (count <= sVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x20);
  puVar3 = (uint *)__errno_location();
  fmt.str.data_ = (char *)(ulong)*puVar3;
  fmt.str.size_ = (size_t)"cannot write to file";
  system_error<>((int)uVar2,fmt);
  __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

inline void fwrite_all(const void* ptr, size_t count, FILE* stream) {
  size_t written = std::fwrite(ptr, 1, count, stream);
  if (written < count)
    FMT_THROW(system_error(errno, FMT_STRING("cannot write to file")));
}